

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O2

bool __thiscall Pig::getDigit2(Pig *this,int *result)

{
  bool bVar1;
  intmax_t iVar2;
  char *local_38 [4];
  
  bVar1 = unicodeLatinDigit((int)(((this->_text).
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_M_dataplus)._M_p[this->_cursor]);
  if ((bVar1) &&
     (bVar1 = unicodeLatinDigit((int)(((this->_text).
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p[this->_cursor + 1]), bVar1)) {
    std::__cxx11::string::substr
              ((ulong)local_38,
               (ulong)(this->_text).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
    iVar2 = strtoimax(local_38[0],(char **)0x0,10);
    *result = (int)iVar2;
    std::__cxx11::string::~string((string *)local_38);
    this->_cursor = this->_cursor + 2;
    return true;
  }
  return false;
}

Assistant:

bool Pig::getDigit2 (int& result)
{
  if (unicodeLatinDigit ((*_text)[_cursor + 0]))
  {
    if (unicodeLatinDigit ((*_text)[_cursor + 1]))
    {
      result = strtoimax (_text->substr (_cursor, 2).c_str (), NULL, 10);
      _cursor += 2;
      return true;
    }
  }

  return false;
}